

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O0

void __thiscall
Refal2::CModuleBuilder::SetExternal
          (CModuleBuilder *this,CToken *nameToken,CToken *externalNameToken)

{
  CToken *token;
  bool bVar1;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [32];
  CPreparatoryFunction *local_28;
  CPreparatoryFunction *function;
  CToken *externalNameToken_local;
  CToken *nameToken_local;
  CModuleBuilder *this_local;
  
  function = (CPreparatoryFunction *)externalNameToken;
  externalNameToken_local = nameToken;
  nameToken_local = (CToken *)this;
  bVar1 = checkModuleExist(this,nameToken);
  if (bVar1) {
    local_28 = addFunction(this,externalNameToken_local);
    bVar1 = checkOnlyDeclared(this,local_28,externalNameToken_local);
    if (bVar1) {
      bVar1 = CPreparatoryFunction::IsEntry(local_28);
      token = externalNameToken_local;
      if (bVar1) {
        std::operator+((char *)local_68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17fb48
                      );
        std::operator+(local_48,(char *)local_68);
        error(this,token,local_48);
        std::__cxx11::string::~string((string *)local_48);
        std::__cxx11::string::~string(local_68);
      }
      else {
        CPreparatoryFunction::SetDefined(local_28,externalNameToken_local);
        CPreparatoryFunction::SetExternal(local_28,(CToken *)function);
      }
    }
  }
  return;
}

Assistant:

void CModuleBuilder::SetExternal( const CToken& nameToken,
	const CToken& externalNameToken )
{
	if( !checkModuleExist( nameToken ) ) {
		return;
	}
	CPreparatoryFunction& function = addFunction( nameToken );
	if( checkOnlyDeclared( function, nameToken ) ) {
		if( !function.IsEntry() ) {
			function.SetDefined( nameToken );
			function.SetExternal( externalNameToken );
		} else {
			error( nameToken, "function `" + nameToken.word +
				"` already defined as entry" );
		}
	}
}